

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

HighsTripletTreeSlicePreOrder * __thiscall
presolve::HPresolve::getRowVector(HPresolve *this,HighsInt row)

{
  int *piVar1;
  double *pdVar2;
  int *piVar3;
  HighsTripletTreeSlicePreOrder *this_00;
  int in_EDX;
  long in_RSI;
  HighsTripletTreeSlicePreOrder *in_RDI;
  HighsTripletTreeSlicePreOrder *pHVar4;
  
  pHVar4 = in_RDI;
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x6ebc99);
  pdVar2 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x6ebcab);
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x6ebcc0);
  this_00 = (HighsTripletTreeSlicePreOrder *)
            std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x6ebcd5);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xb8),(long)in_EDX);
  HighsTripletTreeSlicePreOrder::HighsMatrixSlice
            (this_00,piVar3,pdVar2,piVar1,(HighsInt *)pHVar4,(HighsInt)((ulong)in_RSI >> 0x20));
  return in_RDI;
}

Assistant:

HighsTripletTreeSlicePreOrder HPresolve::getRowVector(HighsInt row) const {
  return HighsTripletTreeSlicePreOrder(
      Acol.data(), Avalue.data(), ARleft.data(), ARright.data(), rowroot[row]);
}